

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O0

string * __thiscall
magic_enum::containers::
bitset<Color,magic_enum::containers::detail::indexing<Color,std::less<Color>,void>>::
to_string_abi_cxx11_(string *__return_storage_ptr__,void *this,char_type sep)

{
  bool bVar1;
  const_iterator pvVar2;
  const_pointer __s;
  size_type __n;
  undefined1 local_60 [8];
  enable_if_t<Color,_string_view> n;
  value_type *e;
  const_iterator __end0;
  const_iterator __begin0;
  array<Color,_3UL> *__range3;
  char_type sep_local;
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
  *this_local;
  string *name;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end0 = Catch::clara::std::array<Color,_3UL>::begin
                     ((array<Color,_3UL> *)
                      magic_enum::detail::values_v<Color,(magic_enum::detail::enum_subtype)1>);
  pvVar2 = Catch::clara::std::array<Color,_3UL>::end
                     ((array<Color,_3UL> *)
                      magic_enum::detail::values_v<Color,(magic_enum::detail::enum_subtype)1>);
  for (; __end0 != pvVar2; __end0 = __end0 + 1) {
    bVar1 = bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
            ::test((bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                    *)this,*__end0);
    if (bVar1) {
      bVar1 = Catch::clara::std::__cxx11::
              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (__return_storage_ptr__);
      if (!bVar1) {
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,1,sep);
      }
      _local_60 = enum_name<Color,(magic_enum::detail::enum_subtype)1>(*__end0);
      __s = Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_60);
      __n = Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_60);
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::append(__return_storage_ptr__,__s,__n);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] string to_string(char_type sep = static_cast<char_type>('|')) const {
    string name;

    for (const auto& e : enum_values<E>()) {
      if (test(e)) {
        if (!name.empty()) {
          name.append(1, sep);
        }
        auto n = enum_name(e);
        name.append(n.data(), n.size());
      }
    }
    return name;
  }